

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  atomic<unsigned_long> *paVar2;
  long lVar3;
  ulong uVar4;
  __int_type _Var5;
  __int_type _Var6;
  uint uVar7;
  write_guard wVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar12;
  pthread_t pVar13;
  uint uVar14;
  void *extraout_RDX;
  ushort uVar15;
  optimistic_lock *poVar16;
  undefined1 auVar17 [16];
  __atomic_base<unsigned_long> local_68;
  write_guard node_guard;
  id local_58;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard local_40;
  write_guard child_guard;
  
  auVar17[1] = key_byte;
  auVar17[0] = key_byte;
  auVar17[2] = key_byte;
  auVar17[3] = key_byte;
  auVar17[4] = key_byte;
  auVar17[5] = key_byte;
  auVar17[6] = key_byte;
  auVar17[7] = key_byte;
  auVar17[8] = key_byte;
  auVar17[9] = key_byte;
  auVar17[10] = key_byte;
  auVar17[0xb] = key_byte;
  auVar17[0xc] = key_byte;
  auVar17[0xd] = key_byte;
  auVar17[0xe] = key_byte;
  auVar17[0xf] = key_byte;
  auVar17 = vpcmpeqb_avx(auVar17,(undefined1  [16])
                                 (inode->
                                 super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>
                                 ).keys);
  uVar14 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) &
           ~(-1 << ((inode->super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>).
                    super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    .
                    super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    .children_count.value.super___atomic_base<unsigned_char>._M_i & 0x1f));
  uVar7 = 0;
  if (uVar14 != 0) {
    for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  piVar12 = (inode->super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>).children.
            _M_elems + uVar7;
  if (uVar14 == 0) {
    poVar16 = parent_critical_section->lock;
    _Var5 = (parent_critical_section->version).version;
    if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00162fa0;
    _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var5 != _Var6) {
      LOCK();
      paVar1 = &poVar16->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00162f81;
      if (_Var5 != _Var6) {
LAB_00162db0:
        parent_critical_section->lock = (optimistic_lock *)0x0;
        goto LAB_00162d79;
      }
    }
    LOCK();
    paVar1 = &poVar16->read_lock_count;
    lVar3 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00162f81;
    parent_critical_section->lock = (optimistic_lock *)0x0;
    if (_Var5 != _Var6) goto LAB_00162d79;
    poVar16 = node_critical_section->lock;
    _Var5 = (node_critical_section->version).version;
    if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00162fa0;
    _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var5 == _Var6) {
LAB_00162b6a:
      LOCK();
      paVar1 = &poVar16->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_00162f81:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    else {
      LOCK();
      paVar1 = &poVar16->read_lock_count;
      lVar3 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00162f81;
      if (_Var5 == _Var6) goto LAB_00162b6a;
    }
    bVar9 = _Var5 == _Var6;
    node_critical_section->lock = (optimistic_lock *)0x0;
LAB_00162c5a:
    uVar15 = (ushort)bVar9;
    uVar10 = 0;
  }
  else {
    child->tagged_ptr = (piVar12->value)._M_i.tagged_ptr;
    child_guard.lock._4_4_ = -(uint)(uVar14 == 0);
    bVar9 = optimistic_lock::check
                      (node_critical_section->lock,
                       (version_type)(node_critical_section->version).version);
    if (bVar9) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff98);
      child_critical_section->lock = (optimistic_lock *)local_68._M_i;
      local_68._M_i = 0;
      (child_critical_section->version).version = (version_tag_type)node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffff98);
      if (child_critical_section->lock != (optimistic_lock *)0x0) {
        uVar4 = child->tagged_ptr;
        *child_type = (node_type)uVar4 & (I256|I48);
        if ((uVar4 & 7) != 0) {
          *child_in_parent = piVar12;
          poVar16 = parent_critical_section->lock;
          _Var5 = (parent_critical_section->version).version;
          if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00162fa0;
          _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var5 == _Var6) {
LAB_00162aea:
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
          }
          else {
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
            if (_Var5 == _Var6) goto LAB_00162aea;
          }
          uVar15 = (ushort)(_Var5 == _Var6);
          parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_00162b06:
          uVar10 = 1;
          goto LAB_00162c5c;
        }
        iVar11 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                           ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                            (uVar4 & 0xfffffffffffffff8),(void *)k.field_0,extraout_RDX);
        if (iVar11 != 0) {
          poVar16 = parent_critical_section->lock;
          _Var5 = (parent_critical_section->version).version;
          if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00162fa0;
          _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var5 != _Var6) {
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
            if (_Var5 != _Var6) {
              parent_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_00162d79;
            }
          }
          LOCK();
          paVar1 = &poVar16->read_lock_count;
          lVar3 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00162f81;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var5 != _Var6) goto LAB_00162d79;
          poVar16 = node_critical_section->lock;
          _Var5 = (node_critical_section->version).version;
          if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00162fa0;
          _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var5 != _Var6) {
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
            if (_Var5 != _Var6) {
              node_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_00162d79;
            }
          }
          LOCK();
          paVar1 = &poVar16->read_lock_count;
          lVar3 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00162f81;
          node_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var5 != _Var6) goto LAB_00162d79;
          poVar16 = child_critical_section->lock;
          _Var5 = (child_critical_section->version).version;
          if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_00162fa0:
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var5 == _Var6) {
LAB_00162c3e:
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
          }
          else {
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
            if (_Var5 == _Var6) goto LAB_00162c3e;
          }
          bVar9 = _Var5 == _Var6;
          child_critical_section->lock = (optimistic_lock *)0x0;
          goto LAB_00162c5a;
        }
        child_guard.lock._4_4_ =
             CONCAT31((int3)((uint)child_guard.lock._4_4_ >> 8),
                      (byte)child_guard.lock._4_4_ | (byte)uVar7);
        if ((inode->super_olc_inode_16_parent<unsigned_long,_std::span<const_std::byte>_>).
            super_basic_inode_16_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            .
            super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            .children_count.value.super___atomic_base<unsigned_char>._M_i == '\x05') {
          basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
          ::
          make_db_inode_unique_ptr<unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&>
                    ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                      *)&stack0xffffffffffffff98,db_instance,inode);
          bVar9 = optimistic_lock::try_upgrade_to_write_lock
                            (parent_critical_section->lock,
                             (version_type)(parent_critical_section->version).version);
          local_40.lock = (optimistic_lock *)0x0;
          if (bVar9) {
            local_40.lock = parent_critical_section->lock;
          }
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (local_40.lock != (optimistic_lock *)0x0) {
            bVar9 = optimistic_lock::try_upgrade_to_write_lock
                              (node_critical_section->lock,
                               (version_type)(node_critical_section->version).version);
            child_guard_1.lock = (optimistic_lock *)0x0;
            if (bVar9) {
              child_guard_1.lock = node_critical_section->lock;
            }
            node_critical_section->lock = (optimistic_lock *)0x0;
            if (child_guard_1.lock != (optimistic_lock *)0x0) {
              bVar9 = optimistic_lock::try_upgrade_to_write_lock
                                (child_critical_section->lock,
                                 (version_type)(child_critical_section->version).version);
              poVar16 = (optimistic_lock *)0x0;
              if (bVar9) {
                poVar16 = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              local_58._M_thread = (native_handle_type)poVar16;
              if (poVar16 != (optimistic_lock *)0x0) {
                olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                init((olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                      *)node_guard.lock,(EVP_PKEY_CTX *)db_instance);
                wVar8 = node_guard;
                node_guard.lock = (optimistic_lock *)0x0;
                if (((ulong)wVar8.lock & 7) != 0) {
                  __assert_fail("(result & ptr_bit_mask) == uintptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                ,0x182,
                                "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                               );
                }
                (node_in_parent->value)._M_i.tagged_ptr = (ulong)wVar8.lock | 1;
                if (child_guard_1.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x644,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                               );
                }
                if ((optimistic_lock *)local_58._M_thread != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x645,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>]"
                               );
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa8);
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
                optimistic_lock::write_guard::~write_guard(&local_40);
                std::
                unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffff98);
                if (poVar16 != (optimistic_lock *)0x0) {
                  LOCK();
                  paVar2 = (db_instance->shrinking_inode_counts)._M_elems + 1;
                  (paVar2->super___atomic_base<unsigned_long>)._M_i =
                       (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
                  UNLOCK();
                  uVar10 = 1;
                  uVar15 = 1;
                  goto LAB_00162c5c;
                }
                goto LAB_00162d79;
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa8);
            }
            optimistic_lock::write_guard::~write_guard(&child_guard_1);
          }
          optimistic_lock::write_guard::~write_guard(&local_40);
          std::
          unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)&stack0xffffffffffffff98);
        }
        else {
          poVar16 = parent_critical_section->lock;
          _Var5 = (parent_critical_section->version).version;
          if ((poVar16->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_00162fa0;
          _Var6 = (poVar16->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var5 != _Var6) {
            LOCK();
            paVar1 = &poVar16->read_lock_count;
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_00162f81;
            if (_Var5 != _Var6) goto LAB_00162db0;
          }
          LOCK();
          paVar1 = &poVar16->read_lock_count;
          lVar3 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_00162f81;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var5 == _Var6) {
            bVar9 = optimistic_lock::try_upgrade_to_write_lock
                              (node_critical_section->lock,
                               (version_type)(node_critical_section->version).version);
            uVar15 = 0;
            local_68._M_i = 0;
            if (bVar9) {
              local_68._M_i = (__int_type)node_critical_section->lock;
            }
            node_critical_section->lock = (optimistic_lock *)0x0;
            if ((optimistic_lock *)local_68._M_i != (optimistic_lock *)0x0) {
              bVar9 = optimistic_lock::try_upgrade_to_write_lock
                                (child_critical_section->lock,
                                 (version_type)(child_critical_section->version).version);
              poVar16 = (optimistic_lock *)0x0;
              if (bVar9) {
                poVar16 = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              local_40.lock = poVar16;
              if (poVar16 != (optimistic_lock *)0x0) {
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar16->version);
                pVar13 = pthread_self();
                (poVar16->obsoleter_thread)._M_thread = pVar13;
                local_40.lock = (optimistic_lock *)0x0;
                olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                remove(inode,(char *)(ulong)child_guard.lock._4_1_);
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
              }
              uVar15 = (ushort)(poVar16 != (optimistic_lock *)0x0);
              optimistic_lock::write_guard::~write_guard(&local_40);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff98);
            goto LAB_00162b06;
          }
        }
      }
    }
    else {
      node_critical_section->lock = (optimistic_lock *)0x0;
    }
LAB_00162d79:
    uVar10 = 0;
    uVar15 = 0;
  }
LAB_00162c5c:
  return (_Optional_base<bool,_true,_true>)(uVar10 | uVar15 << 8);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}